

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

string * __thiscall
TgBot::TgTypeParser::parseLocation_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  bool bVar1;
  element_type *peVar2;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  undefined1 local_35;
  allocator local_21;
  __shared_ptr_access<TgBot::Location,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  Ptr *object_local;
  TgTypeParser *this_local;
  string *result;
  
  local_20 = (__shared_ptr_access<TgBot::Location,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             object;
  object_local = (Ptr *)this;
  this_local = (TgTypeParser *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)object);
  if (bVar1) {
    local_35 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'{');
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"longitude",&local_59);
    peVar2 = std::__shared_ptr_access<TgBot::Location,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson<float>(this,__return_storage_ptr__,&local_58,&peVar2->longitude);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"latitude",&local_81);
    peVar2 = std::__shared_ptr_access<TgBot::Location,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson<float>(this,__return_storage_ptr__,&local_80,&peVar2->latitude);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'}');
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseLocation(const Location::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "longitude", object->longitude);
    appendToJson(result, "latitude", object->latitude);
    removeLastComma(result);
    result += '}';
    return result;
}